

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

bool __thiscall
clickhouse::Client::Impl::ReceiveData(Impl *this,function<void_(const_clickhouse::Block_&)> *cb)

{
  CodedInputStream *this_00;
  undefined1 *puVar1;
  bool bVar2;
  undefined8 uVar3;
  Impl *this_01;
  Impl *this_02;
  CodedInputStream coded;
  string table_name;
  uint64_t len;
  Block block;
  undefined1 auStack_b8 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  ArrayInput local_68;
  Block local_50;
  
  this_02 = (Impl *)auStack_b8;
  Block::Block(&local_50);
  puVar1 = auStack_b8 + 0x18;
  auStack_b8._16_8_ = 0;
  auStack_b8[0x18] = '\0';
  this_00 = &this->input_;
  auStack_b8._8_8_ = puVar1;
  bVar2 = CodedInputStream::ReadVarint64(this_00,(uint64_t *)(auStack_b8 + 0x28));
  if ((bVar2) && ((ulong)auStack_b8._40_8_ < (undefined **)0x1000000)) {
    std::__cxx11::string::resize((ulong)(auStack_b8 + 8),(char)auStack_b8._40_8_);
    this_01 = (Impl *)this_00;
    bVar2 = CodedInputStream::ReadRaw(this_00,(void *)auStack_b8._8_8_,auStack_b8._40_8_);
    if (bVar2) {
      if (this->compression_ == 1) {
        CompressedInput::CompressedInput((CompressedInput *)(auStack_b8 + 0x28),this_00);
        CodedInputStream::CodedInputStream
                  ((CodedInputStream *)auStack_b8,(ZeroCopyInput *)(auStack_b8 + 0x28));
        bVar2 = ReadBlock(this_02,&local_50,(CodedInputStream *)auStack_b8);
        auStack_b8._40_8_ = &PTR__CompressedInput_0016b1b8;
        ArrayInput::~ArrayInput(&local_68);
        if ((void *)local_80._M_allocated_capacity != (void *)0x0) {
          operator_delete((void *)local_80._M_allocated_capacity,
                          (long)local_70._M_p - local_80._0_8_);
        }
        if (bVar2) {
LAB_0014e4a3:
          if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
            uVar3 = std::__throw_bad_function_call();
            if ((void *)local_80._M_allocated_capacity != (void *)0x0) {
              operator_delete((void *)local_80._M_allocated_capacity,
                              (long)local_70._M_p - local_80._0_8_);
            }
            if ((undefined1 *)auStack_b8._8_8_ != puVar1) {
              operator_delete((void *)auStack_b8._8_8_,
                              CONCAT71(auStack_b8._25_7_,auStack_b8[0x18]) + 1);
            }
            Block::~Block(&local_50);
            _Unwind_Resume(uVar3);
          }
          bVar2 = true;
          (*cb->_M_invoker)((_Any_data *)cb,&local_50);
          goto LAB_0014e45f;
        }
      }
      else {
        bVar2 = ReadBlock(this_01,&local_50,this_00);
        if (bVar2) goto LAB_0014e4a3;
      }
    }
  }
  bVar2 = false;
LAB_0014e45f:
  if ((undefined1 *)auStack_b8._8_8_ != puVar1) {
    operator_delete((void *)auStack_b8._8_8_,CONCAT71(auStack_b8._25_7_,auStack_b8[0x18]) + 1);
  }
  Block::~Block(&local_50);
  return bVar2;
}

Assistant:

bool Client::Impl::ReceiveData(std::function<void(const Block&)> cb) {
    Block block;
    std::string table_name;

    // Read name of a table.
    if (!WireFormat::ReadString(&input_, &table_name)) {
        return false;
    }

    if (compression_ == CompressionState::Enable) {
        CompressedInput compressed(&input_);
        CodedInputStream coded(&compressed);

        if (!ReadBlock(&block, &coded)) {
            return false;
        }
    } else {
        if (!ReadBlock(&block, &input_)) {
            return false;
        }
    }

    cb(block);

    return true;
}